

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io_tests.cpp
# Opt level: O3

void __thiscall key_io_tests::key_io_invalid::test_method(key_io_invalid *this)

{
  pointer pcVar1;
  array<unsigned_char,_32UL> *t;
  undefined8 uVar2;
  bool bVar3;
  UniValue *pUVar4;
  string *psVar5;
  ulong uVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  size_t index;
  long lVar9;
  long in_FS_OFFSET;
  string_view jsondata;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  string exp_base58string;
  string strTest;
  CTxDestination destination;
  UniValue tests;
  check_type cVar10;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  assertion_result local_220;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  uchar local_1b8;
  array<unsigned_char,_32UL> *local_1b0;
  undefined1 local_1a8 [16];
  undefined1 auStack_198 [16];
  undefined1 local_188 [16];
  undefined1 *local_178;
  undefined8 local_170;
  __index_type local_140;
  _Type local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [32];
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_e8;
  undefined1 local_a0;
  UniValue local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  jsondata._M_str = json_tests::detail_key_io_invalid_bytes;
  jsondata._M_len = 0x1449;
  read_json(&local_90,jsondata);
  local_1b8 = '\0';
  local_1b0 = (array<unsigned_char,_32UL> *)0x0;
  local_e8._16_8_ = (pointer)0x0;
  local_e8._24_8_ = (pointer)0x0;
  local_e8._0_8_ = 0;
  local_e8._8_8_ = (pointer)0x0;
  local_a0 = 0;
  if (local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    index = 0;
    do {
      pUVar4 = ::UniValue::operator[](&local_90,index);
      ::UniValue::write_abi_cxx11_((UniValue *)local_108,(int)pUVar4,(void *)0x0,0);
      if ((pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_1c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_1c0 = "";
        local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_01.m_end = (iterator)0x86;
        file_01.m_begin = (iterator)&local_1c8;
        msg_01.m_end = in_R9;
        msg_01.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1d8
                   ,msg_01);
        local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffffff00;
        local_1a8._8_8_ = 0;
        auStack_198._0_8_ = 0;
        local_128[8] = 0;
        local_128._0_8_ = &PTR__lazy_ostream_013adbd8;
        local_118._0_8_ = boost::unit_test::lazy_ostream::inst;
        local_118._8_8_ = "Bad test: ";
        local_188._8_8_ = local_188._8_8_ & 0xffffffffffffff00;
        local_188._0_8_ = &PTR__lazy_ostream_013adc18;
        local_178 = local_128;
        local_170 = local_108;
        local_1e8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_1e0 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x1;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_1a8,(lazy_ostream *)local_188,1,1,WARN,_cVar10,
                   (size_t)&local_1e8,0x86);
        boost::detail::shared_count::~shared_count((shared_count *)(local_1a8 + 0x10));
      }
      else {
        pUVar4 = ::UniValue::operator[](pUVar4,0);
        psVar5 = ::UniValue::get_str_abi_cxx11_(pUVar4);
        local_128._0_8_ = local_118;
        pcVar1 = (psVar5->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_128,pcVar1,pcVar1 + psVar5->_M_string_length);
        local_138[0] = OUTPUT_TYPES._M_elems[0];
        local_138[1] = OUTPUT_TYPES._M_elems[1];
        local_138[2] = OUTPUT_TYPES._M_elems[2];
        local_138[3] = OUTPUT_TYPES._M_elems[3];
        lVar9 = 0;
        do {
          SelectParams(*(ChainType *)((long)local_138 + lVar9));
          DecodeDestination((CTxDestination *)local_188,(string *)local_128);
          local_1a8._0_8_ = &local_e8;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&>
            ::_S_vtable._M_arr[(long)(char)local_140 + 1]._M_data)
                    ((anon_class_8_1_8991fb9c *)local_1a8,
                     (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)local_188);
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)local_188);
          local_1f8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_1f0 = "";
          local_208 = &boost::unit_test::basic_cstring<char_const>::null;
          local_200 = &boost::unit_test::basic_cstring<char_const>::null;
          file.m_end = (iterator)0x8f;
          file.m_begin = (iterator)&local_1f8;
          msg.m_end = in_R9;
          msg.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_208,
                     msg);
          bVar3 = IsValidDestination((CTxDestination *)&local_e8._M_first);
          local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)!bVar3;
          local_220.m_message.px = (element_type *)0x0;
          local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,"IsValid pubkey in mainnet:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108);
          local_188._8_8_ = local_188._8_8_ & 0xffffffffffffff00;
          local_188._0_8_ = &PTR__lazy_ostream_013adf88;
          local_178 = boost::unit_test::lazy_ostream::inst;
          local_230 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_228 = "";
          pvVar7 = (iterator)0x1;
          pvVar8 = (iterator)0x1;
          local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
          ;
          boost::test_tools::tt_detail::report_assertion
                    (&local_220,(lazy_ostream *)local_188,1,1,WARN,_cVar10,(size_t)&local_230,0x8f);
          if ((_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)local_1a8._0_8_ !=
              (_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,auStack_198._0_8_ + 1);
          }
          boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
          DecodeSecret((string *)local_188);
          uVar2 = local_188._8_8_;
          t = local_1b0;
          local_1b8 = local_188[0];
          local_188._8_8_ = (array<unsigned_char,_32UL> *)0x0;
          local_1b0 = (array<unsigned_char,_32UL> *)uVar2;
          if (t != (array<unsigned_char,_32UL> *)0x0) {
            SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                      ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_1b0,t);
            if ((array<unsigned_char,_32UL> *)local_188._8_8_ != (array<unsigned_char,_32UL> *)0x0)
            {
              SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                        ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)(local_188 + 8),
                         (array<unsigned_char,_32UL> *)local_188._8_8_);
            }
          }
          local_240 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_238 = "";
          local_250 = &boost::unit_test::basic_cstring<char_const>::null;
          local_248 = &boost::unit_test::basic_cstring<char_const>::null;
          file_00.m_end = (iterator)0x91;
          file_00.m_begin = (iterator)&local_240;
          msg_00.m_end = pvVar8;
          msg_00.m_begin = pvVar7;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
                     (size_t)&local_250,msg_00);
          local_220.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(local_1b0 == (array<unsigned_char,_32UL> *)0x0);
          local_220.m_message.px = (element_type *)0x0;
          local_220.m_message.pn.pi_ = (sp_counted_base *)0x0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,"IsValid privkey in mainnet:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108);
          local_188._8_8_ = local_188._8_8_ & 0xffffffffffffff00;
          local_188._0_8_ = &PTR__lazy_ostream_013adf88;
          local_178 = boost::unit_test::lazy_ostream::inst;
          local_260 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_258 = "";
          in_R8 = (iterator)0x1;
          in_R9 = (iterator)0x1;
          local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
          ;
          boost::test_tools::tt_detail::report_assertion
                    (&local_220,(lazy_ostream *)local_188,1,1,WARN,_cVar10,(size_t)&local_260,0x91);
          if ((_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)local_1a8._0_8_ !=
              (_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,auStack_198._0_8_ + 1);
          }
          boost::detail::shared_count::~shared_count(&local_220.m_message.pn);
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0x10);
        if ((undefined1 *)local_128._0_8_ != local_118) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_118._0_8_ + 1));
        }
      }
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      index = (size_t)((int)index + 1);
      uVar6 = ((long)local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
    } while (index <= uVar6 && uVar6 - index != 0);
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_e8._M_first);
  if (local_1b0 != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_1b0,local_1b0);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p != &local_90.val.field_2) {
    operator_delete(local_90.val._M_dataplus._M_p,local_90.val.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(key_io_invalid)
{
    UniValue tests = read_json(json_tests::key_io_invalid); // Negative testcases
    CKey privkey;
    CTxDestination destination;

    for (unsigned int idx = 0; idx < tests.size(); idx++) {
        const UniValue& test = tests[idx];
        std::string strTest = test.write();
        if (test.size() < 1) // Allow for extra stuff (useful for comments)
        {
            BOOST_ERROR("Bad test: " << strTest);
            continue;
        }
        std::string exp_base58string = test[0].get_str();

        // must be invalid as public and as private key
        for (const auto& chain : {ChainType::MAIN, ChainType::TESTNET, ChainType::SIGNET, ChainType::REGTEST}) {
            SelectParams(chain);
            destination = DecodeDestination(exp_base58string);
            BOOST_CHECK_MESSAGE(!IsValidDestination(destination), "IsValid pubkey in mainnet:" + strTest);
            privkey = DecodeSecret(exp_base58string);
            BOOST_CHECK_MESSAGE(!privkey.IsValid(), "IsValid privkey in mainnet:" + strTest);
        }
    }
}